

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O2

bool __thiscall
spvtools::Optimizer::RegisterPassFromFlag(Optimizer *this,string *flag,bool preserve_interface)

{
  bool bVar1;
  uint32_t size_limit;
  uint uVar2;
  int factor;
  long lVar3;
  char *pcVar4;
  MessageConsumer *pMVar5;
  _Alloc_hider _Var6;
  double load_replacement_threshold;
  __integer_from_chars_result_type<unsigned_int> _Var7;
  string struct_name;
  string pass_name;
  string pass_args;
  uint32_t to_set;
  uint32_t from_set;
  string rule_name;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  
  bVar1 = FlagHasValidForm(this,flag);
  if (!bVar1) {
    return false;
  }
  utils::SplitFlagArgs(&p,flag);
  std::__cxx11::string::string((string *)&pass_name,(string *)&p);
  std::__cxx11::string::string((string *)&pass_args,(string *)&p.second);
  bVar1 = std::operator==(&pass_name,"strip-debug");
  if (bVar1) {
    CreateStripDebugInfoPass();
LAB_00173e4a:
    RegisterPass(this,(PassToken *)&struct_name);
    std::
    unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
    ::~unique_ptr((unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
                   *)&struct_name);
  }
  else {
    bVar1 = std::operator==(&pass_name,"strip-reflect");
    if ((bVar1) || (bVar1 = std::operator==(&pass_name,"strip-nonsemantic"), bVar1)) {
      CreateStripNonSemanticInfoPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"fix-opextinst-opcodes");
    if (bVar1) {
      CreateOpExtInstWithForwardReferenceFixupPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"set-spec-const-default-value");
    if (bVar1) {
      if (pass_args._M_string_length == 0) {
        pMVar5 = &(((this->impl_)._M_t.
                    super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                    .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl)->
                  pass_manager).consumer_;
        rule_name._M_dataplus = pass_args._M_dataplus;
        pcVar4 = 
        "Invalid spec constant value string \'%s\'. Expected a string of <spec id>:<default value> pairs."
        ;
        goto LAB_00173f90;
      }
      opt::SetSpecConstantDefaultValuePass::ParseDefaultValuesString_abi_cxx11_
                ((SetSpecConstantDefaultValuePass *)&rule_name,pass_args._M_dataplus._M_p);
      _Var6 = rule_name._M_dataplus;
      if (rule_name._M_dataplus._M_p == (pointer)0x0) {
        struct_name.field_2._M_allocated_capacity = 0;
        struct_name._M_dataplus._M_p = (pointer)0x0;
        struct_name._M_string_length = 0;
        _from_set = pass_args._M_dataplus._M_p;
        Errorf<char_const*>(&(((this->impl_)._M_t.
                               super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                               .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>.
                              _M_head_impl)->pass_manager).consumer_,(char *)0x0,
                            (spv_position_t *)&struct_name,
                            "Invalid argument for --set-spec-const-default-value: %s",
                            (char **)&from_set);
      }
      else {
        CreateSetSpecConstantDefaultValuePass
                  ((spvtools *)&struct_name,
                   (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)rule_name._M_dataplus._M_p);
        RegisterPass(this,(PassToken *)&struct_name);
        std::
        unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
        ::~unique_ptr((unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
                       *)&struct_name);
      }
      std::
      unique_ptr<std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~unique_ptr((unique_ptr<std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)&rule_name);
LAB_00173fff:
      if (_Var6._M_p == (pointer)0x0) {
LAB_00174008:
        bVar1 = false;
        goto LAB_00173e5f;
      }
      goto LAB_00173e5d;
    }
    bVar1 = std::operator==(&pass_name,"if-conversion");
    if (bVar1) {
      CreateIfConversionPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"freeze-spec-const");
    if (bVar1) {
      CreateFreezeSpecConstantValuePass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"inline-entry-points-exhaustive");
    if (bVar1) {
      CreateInlineExhaustivePass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"inline-entry-points-opaque");
    if (bVar1) {
      CreateInlineOpaquePass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"combine-access-chains");
    if (bVar1) {
      CreateCombineAccessChainsPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"convert-local-access-chains");
    if (bVar1) {
      CreateLocalAccessChainConvertPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"replace-desc-array-access-using-var-index");
    if (bVar1) {
      CreateReplaceDescArrayAccessUsingVarIndexPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"spread-volatile-semantics");
    if (bVar1) {
      CreateSpreadVolatileSemanticsPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"descriptor-scalar-replacement");
    if (bVar1) {
      CreateDescriptorScalarReplacementPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"descriptor-composite-scalar-replacement");
    if (bVar1) {
      CreateDescriptorCompositeScalarReplacementPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"descriptor-array-scalar-replacement");
    if (bVar1) {
      CreateDescriptorArrayScalarReplacementPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"eliminate-dead-code-aggressive");
    if (bVar1) {
      CreateAggressiveDCEPass((spvtools *)&struct_name,preserve_interface);
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"eliminate-insert-extract");
    if (bVar1) {
      CreateInsertExtractElimPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"eliminate-local-single-block");
    if (bVar1) {
      CreateLocalSingleBlockLoadStoreElimPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"eliminate-local-single-store");
    if (bVar1) {
      CreateLocalSingleStoreElimPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"merge-blocks");
    if (bVar1) {
      CreateBlockMergePass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"merge-return");
    if (bVar1) {
      CreateMergeReturnPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"eliminate-dead-branches");
    if (bVar1) {
      CreateDeadBranchElimPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"eliminate-dead-functions");
    if (bVar1) {
      CreateEliminateDeadFunctionsPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"eliminate-local-multi-store");
    if (bVar1) {
      CreateLocalMultiStoreElimPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"eliminate-dead-const");
    if (bVar1) {
      CreateEliminateDeadConstantPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"eliminate-dead-inserts");
    if (bVar1) {
      CreateDeadInsertElimPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"eliminate-dead-variables");
    if (bVar1) {
      CreateDeadVariableEliminationPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"eliminate-dead-members");
    if (bVar1) {
      CreateEliminateDeadMembersPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"fold-spec-const-op-composite");
    if (bVar1) {
      CreateFoldSpecConstantOpAndCompositePass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"loop-unswitch");
    if (bVar1) {
      CreateLoopUnswitchPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"scalar-replacement");
    if (bVar1) {
      if (pass_args._M_string_length == 0) {
        size_limit = 100;
      }
      else {
        lVar3 = std::__cxx11::string::find_first_not_of((char *)&pass_args,0x2b946d);
        if ((lVar3 != -1) || (size_limit = atoi(pass_args._M_dataplus._M_p), (int)size_limit < 0)) {
          pMVar5 = &(((this->impl_)._M_t.
                      super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                      .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl)->
                    pass_manager).consumer_;
          pcVar4 = "--scalar-replacement must have no arguments or a non-negative integer argument";
          goto LAB_001743c2;
        }
      }
      CreateScalarReplacementPass((spvtools *)&struct_name,size_limit);
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"strength-reduction");
    if (bVar1) {
      CreateStrengthReductionPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"unify-const");
    if (bVar1) {
      CreateUnifyConstantPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"flatten-decorations");
    if (bVar1) {
      CreateFlattenDecorationPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"compact-ids");
    if (bVar1) {
      CreateCompactIdsPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"cfg-cleanup");
    if (bVar1) {
      CreateCFGCleanupPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"local-redundancy-elimination");
    if (bVar1) {
      CreateLocalRedundancyEliminationPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"loop-invariant-code-motion");
    if (bVar1) {
      CreateLoopInvariantCodeMotionPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"reduce-load-size");
    if (bVar1) {
      if (pass_args._M_string_length == 0) {
        load_replacement_threshold = 0.9;
      }
      else {
        lVar3 = std::__cxx11::string::find_first_not_of((char *)&pass_args,0x2b946c);
        if (lVar3 == -1) {
          load_replacement_threshold = atof(pass_args._M_dataplus._M_p);
          if (load_replacement_threshold < 0.0) {
            pMVar5 = &(((this->impl_)._M_t.
                        super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                        .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl)->
                      pass_manager).consumer_;
            pcVar4 = "--reduce-load-size must have no arguments or a non-negative double argument";
            goto LAB_001743c2;
          }
        }
        else {
          load_replacement_threshold = 0.9;
        }
      }
      CreateReduceLoadSizePass((spvtools *)&struct_name,load_replacement_threshold);
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"redundancy-elimination");
    if (bVar1) {
      CreateRedundancyEliminationPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"private-to-local");
    if (bVar1) {
      CreatePrivateToLocalPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"remove-duplicates");
    if (bVar1) {
      CreateRemoveDuplicatesPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"workaround-1209");
    if (bVar1) {
      CreateWorkaround1209Pass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"replace-invalid-opcode");
    if (bVar1) {
      CreateReplaceInvalidOpcodePass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"convert-relaxed-to-half");
    if (bVar1) {
      CreateConvertRelaxedToHalfPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"relax-float-ops");
    if (bVar1) {
      CreateRelaxFloatOpsPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"inst-debug-printf");
    if (bVar1) {
      CreateInstDebugPrintfPass((spvtools *)&struct_name,7,0x17);
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"simplify-instructions");
    if (bVar1) {
      CreateSimplificationPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"ssa-rewrite");
    if (bVar1) {
      CreateSSARewritePass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"copy-propagate-arrays");
    if (bVar1) {
      CreateCopyPropagateArraysPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"loop-fission");
    if (bVar1) {
      if ((pass_args._M_string_length == 0) ||
         (uVar2 = atoi(pass_args._M_dataplus._M_p), (int)uVar2 < 1)) {
        pMVar5 = &(((this->impl_)._M_t.
                    super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                    .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl)->
                  pass_manager).consumer_;
        pcVar4 = "--loop-fission must have a positive integer argument";
        goto LAB_001743c2;
      }
      CreateLoopFissionPass((spvtools *)&struct_name,(ulong)uVar2);
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"loop-fusion");
    if (bVar1) {
      if ((pass_args._M_string_length == 0) ||
         (uVar2 = atoi(pass_args._M_dataplus._M_p), (int)uVar2 < 1)) {
        pMVar5 = &(((this->impl_)._M_t.
                    super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                    .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl)->
                  pass_manager).consumer_;
        pcVar4 = "--loop-fusion must have a positive integer argument";
        goto LAB_001743c2;
      }
      CreateLoopFusionPass((spvtools *)&struct_name,(ulong)uVar2);
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"loop-unroll");
    if (bVar1) {
      bVar1 = true;
      factor = 0;
LAB_0017489e:
      CreateLoopUnrollPass((spvtools *)&struct_name,bVar1,factor);
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"upgrade-memory-model");
    if (bVar1) {
      CreateUpgradeMemoryModelPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"vector-dce");
    if (bVar1) {
      CreateVectorDCEPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"loop-unroll-partial");
    if (bVar1) {
      if ((pass_args._M_string_length != 0) &&
         (factor = atoi(pass_args._M_dataplus._M_p), 0 < factor)) {
        bVar1 = false;
        goto LAB_0017489e;
      }
      pMVar5 = &(((this->impl_)._M_t.
                  super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                  .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl)->
                pass_manager).consumer_;
      pcVar4 = "--loop-unroll-partial must have a positive integer argument";
LAB_001743c2:
      struct_name.field_2._M_allocated_capacity = 0;
      struct_name._M_string_length = 0;
      struct_name._M_dataplus._M_p = (pointer)0x0;
      bVar1 = false;
      Error(pMVar5,(char *)0x0,(spv_position_t *)&struct_name,pcVar4);
      goto LAB_00173e5f;
    }
    bVar1 = std::operator==(&pass_name,"loop-peeling");
    if (bVar1) {
      CreateLoopPeelingPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"loop-peeling-threshold");
    if (bVar1) {
      if ((pass_args._M_string_length != 0) &&
         (uVar2 = atoi(pass_args._M_dataplus._M_p), 0 < (int)uVar2)) {
        opt::LoopPeelingPass::code_grow_threshold_ = (ulong)uVar2;
        goto LAB_00173e5d;
      }
      pMVar5 = &(((this->impl_)._M_t.
                  super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                  .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl)->
                pass_manager).consumer_;
      pcVar4 = "--loop-peeling-threshold must have a positive integer argument";
      goto LAB_001743c2;
    }
    bVar1 = std::operator==(&pass_name,"ccp");
    if (bVar1) {
      CreateCCPPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"code-sink");
    if (bVar1) {
      CreateCodeSinkingPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"fix-storage-class");
    if (bVar1) {
      CreateFixStorageClassPass();
      goto LAB_00173e4a;
    }
    bVar1 = std::operator==(&pass_name,"O");
    if (bVar1) {
      RegisterPerformancePasses(this,preserve_interface);
    }
    else {
      bVar1 = std::operator==(&pass_name,"Os");
      if (bVar1) {
        RegisterSizePasses(this,preserve_interface);
      }
      else {
        bVar1 = std::operator==(&pass_name,"legalize-hlsl");
        if (!bVar1) {
          bVar1 = std::operator==(&pass_name,"remove-unused-interface-variables");
          if (bVar1) {
            CreateRemoveUnusedInterfaceVariablesPass();
          }
          else {
            bVar1 = std::operator==(&pass_name,"graphics-robust-access");
            if (bVar1) {
              CreateGraphicsRobustAccessPass();
            }
            else {
              bVar1 = std::operator==(&pass_name,"wrap-opkill");
              if (bVar1) {
                CreateWrapOpKillPass();
              }
              else {
                bVar1 = std::operator==(&pass_name,"amd-ext-to-khr");
                if (bVar1) {
                  CreateAmdExtToKhrPass();
                }
                else {
                  bVar1 = std::operator==(&pass_name,"interpolate-fixup");
                  if (bVar1) {
                    CreateInterpolateFixupPass();
                  }
                  else {
                    bVar1 = std::operator==(&pass_name,"remove-dont-inline");
                    if (bVar1) {
                      CreateRemoveDontInlinePass();
                    }
                    else {
                      bVar1 = std::operator==(&pass_name,"eliminate-dead-input-components");
                      if (bVar1) {
                        CreateEliminateDeadInputComponentsSafePass();
                      }
                      else {
                        bVar1 = std::operator==(&pass_name,"fix-func-call-param");
                        if (!bVar1) {
                          bVar1 = std::operator==(&pass_name,"convert-to-sampled-image");
                          if (bVar1) {
                            if (pass_args._M_string_length != 0) {
                              opt::ConvertToSampledImagePass::ParseDescriptorSetBindingPairsString
                                        ((ConvertToSampledImagePass *)&rule_name,
                                         pass_args._M_dataplus._M_p);
                              _Var6 = rule_name._M_dataplus;
                              if (rule_name._M_dataplus._M_p == (pointer)0x0) {
                                struct_name.field_2._M_allocated_capacity = 0;
                                struct_name._M_dataplus._M_p = (pointer)0x0;
                                struct_name._M_string_length = 0;
                                _from_set = pass_args._M_dataplus._M_p;
                                Errorf<char_const*>(&(((this->impl_)._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                                                  .
                                                  super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>
                                                  ._M_head_impl)->pass_manager).consumer_,
                                                  (char *)0x0,(spv_position_t *)&struct_name,
                                                  "Invalid argument for --convert-to-sampled-image: %s"
                                                  ,(char **)&from_set);
                              }
                              else {
                                CreateConvertToSampledImagePass
                                          ((spvtools *)&struct_name,
                                           (vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
                                            *)rule_name._M_dataplus._M_p);
                                RegisterPass(this,(PassToken *)&struct_name);
                                std::
                                unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
                                ::~unique_ptr((unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
                                               *)&struct_name);
                              }
                              std::
                              unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                              ::~unique_ptr((unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                                             *)&rule_name);
                              goto LAB_00173fff;
                            }
                            pMVar5 = &(((this->impl_)._M_t.
                                        super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                                        .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>.
                                       _M_head_impl)->pass_manager).consumer_;
                            rule_name._M_dataplus = (_Alloc_hider)pass_args._M_dataplus._M_p;
                            pcVar4 = 
                            "Invalid pairs of descriptor set and binding \'%s\'. Expected a string of <descriptor set>:<binding> pairs."
                            ;
                          }
                          else {
                            bVar1 = std::operator==(&pass_name,"struct-packing");
                            if (!bVar1) {
                              bVar1 = std::operator==(&pass_name,"switch-descriptorset");
                              if (bVar1) {
                                if (pass_args._M_string_length == 0) {
                                  pMVar5 = &(((this->impl_)._M_t.
                                              super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                                              .
                                              super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>
                                             ._M_head_impl)->pass_manager).consumer_;
                                  pcVar4 = "--switch-descriptorset requires a from:to argument.";
                                  goto LAB_001743c2;
                                }
                                _from_set = (pointer)((ulong)_from_set & 0xffffffff00000000);
                                to_set = 0;
                                pcVar4 = pass_args._M_dataplus._M_p + pass_args._M_string_length;
                                _Var7 = std::from_chars<unsigned_int>
                                                  (pass_args._M_dataplus._M_p,pcVar4,&from_set,10);
                                if (((_Var7.ec != 0) || (*_Var7.ptr != ':')) ||
                                   (_Var7 = std::from_chars<unsigned_int>
                                                      (_Var7.ptr + 1,pcVar4,&to_set,10),
                                   _Var7.ec != 0 || _Var7.ptr != pcVar4)) {
                                  struct_name.field_2._M_allocated_capacity = 0;
                                  struct_name._M_dataplus._M_p = (pointer)0x0;
                                  struct_name._M_string_length = 0;
                                  rule_name._M_dataplus = pass_args._M_dataplus;
                                  Errorf<char_const*>(&(((this->impl_)._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                                                  .
                                                  super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>
                                                  ._M_head_impl)->pass_manager).consumer_,
                                                  (char *)0x0,(spv_position_t *)&struct_name,
                                                  "Invalid argument for --switch-descriptorset: %s",
                                                  (char **)&rule_name);
                                  goto LAB_00174008;
                                }
                                CreateSwitchDescriptorSetPass
                                          ((spvtools *)&struct_name,from_set,to_set);
                              }
                              else {
                                bVar1 = std::operator==(&pass_name,"modify-maximal-reconvergence");
                                if (bVar1) {
                                  if (pass_args._M_string_length == 0) {
                                    pMVar5 = &(((this->impl_)._M_t.
                                                super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                                                .
                                                super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>
                                               ._M_head_impl)->pass_manager).consumer_;
                                    pcVar4 = "--modify-maximal-reconvergence requires an argument";
                                    goto LAB_001743c2;
                                  }
                                  bVar1 = std::operator==(&pass_args,"add");
                                  if (bVar1) {
                                    bVar1 = true;
                                  }
                                  else {
                                    bVar1 = std::operator==(&pass_args,"remove");
                                    if (!bVar1) {
                                      pMVar5 = &(((this->impl_)._M_t.
                                                  super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                                                  .
                                                  super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>
                                                 ._M_head_impl)->pass_manager).consumer_;
                                      rule_name._M_dataplus = pass_args._M_dataplus;
                                      pcVar4 = 
                                      "Invalid argument for --modify-maximal-reconvergence: %s (must be \'add\' or \'remove\')"
                                      ;
                                      goto LAB_00173f90;
                                    }
                                    bVar1 = false;
                                  }
                                  CreateModifyMaximalReconvergencePass
                                            ((spvtools *)&struct_name,bVar1);
                                }
                                else {
                                  bVar1 = std::operator==(&pass_name,"trim-capabilities");
                                  if (!bVar1) {
                                    pMVar5 = &(((this->impl_)._M_t.
                                                super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                                                .
                                                super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>
                                               ._M_head_impl)->pass_manager).consumer_;
                                    rule_name._M_dataplus = pass_name._M_dataplus;
                                    pcVar4 = 
                                    "Unknown flag \'--%s\'. Use --help for a list of valid flags";
                                    goto LAB_00173f90;
                                  }
                                  CreateTrimCapabilitiesPass();
                                }
                              }
                              goto LAB_00173e4a;
                            }
                            if (pass_args._M_string_length == 0) {
                              pMVar5 = &(((this->impl_)._M_t.
                                          super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                                          .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>
                                         ._M_head_impl)->pass_manager).consumer_;
                              pcVar4 = "--struct-packing requires a name:rule argument.";
                              goto LAB_001743c2;
                            }
                            lVar3 = std::__cxx11::string::find((char)&pass_args,0x3a);
                            if ((1 < lVar3 + 1U) && (lVar3 + 1U != pass_args._M_string_length)) {
                              std::__cxx11::string::substr((ulong)&struct_name,(ulong)&pass_args);
                              std::__cxx11::string::substr((ulong)&rule_name,(ulong)&pass_args);
                              CreateStructPackingPass
                                        ((spvtools *)&from_set,struct_name._M_dataplus._M_p,
                                         rule_name._M_dataplus._M_p);
                              RegisterPass(this,(PassToken *)&from_set);
                              std::
                              unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
                              ::~unique_ptr((unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
                                             *)&from_set);
                              std::__cxx11::string::_M_dispose();
                              std::__cxx11::string::_M_dispose();
                              goto LAB_00173e5d;
                            }
                            pMVar5 = &(((this->impl_)._M_t.
                                        super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                                        .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>.
                                       _M_head_impl)->pass_manager).consumer_;
                            rule_name._M_dataplus = pass_args._M_dataplus;
                            pcVar4 = "Invalid argument for --struct-packing: %s";
                          }
LAB_00173f90:
                          struct_name.field_2._M_allocated_capacity = 0;
                          struct_name._M_string_length = 0;
                          struct_name._M_dataplus._M_p = (pointer)0x0;
                          bVar1 = false;
                          Errorf<char_const*>(pMVar5,(char *)0x0,(spv_position_t *)&struct_name,
                                              pcVar4,(char **)&rule_name);
                          goto LAB_00173e5f;
                        }
                        CreateFixFuncCallArgumentsPass();
                      }
                    }
                  }
                }
              }
            }
          }
          goto LAB_00173e4a;
        }
        RegisterLegalizationPasses(this,preserve_interface);
      }
    }
  }
LAB_00173e5d:
  bVar1 = true;
LAB_00173e5f:
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&p);
  return bVar1;
}

Assistant:

bool Optimizer::RegisterPassFromFlag(const std::string& flag,
                                     bool preserve_interface) {
  if (!FlagHasValidForm(flag)) {
    return false;
  }

  // Split flags of the form --pass_name=pass_args.
  auto p = utils::SplitFlagArgs(flag);
  std::string pass_name = p.first;
  std::string pass_args = p.second;

  // FIXME(dnovillo): This should be re-factored so that pass names can be
  // automatically checked against Pass::name() and PassToken instances created
  // via a template function.  Additionally, class Pass should have a desc()
  // method that describes the pass (so it can be used in --help).
  //
  // Both Pass::name() and Pass::desc() should be static class members so they
  // can be invoked without creating a pass instance.
  if (pass_name == "strip-debug") {
    RegisterPass(CreateStripDebugInfoPass());
  } else if (pass_name == "strip-reflect") {
    RegisterPass(CreateStripReflectInfoPass());
  } else if (pass_name == "strip-nonsemantic") {
    RegisterPass(CreateStripNonSemanticInfoPass());
  } else if (pass_name == "fix-opextinst-opcodes") {
    RegisterPass(CreateOpExtInstWithForwardReferenceFixupPass());
  } else if (pass_name == "set-spec-const-default-value") {
    if (pass_args.size() > 0) {
      auto spec_ids_vals =
          opt::SetSpecConstantDefaultValuePass::ParseDefaultValuesString(
              pass_args.c_str());
      if (!spec_ids_vals) {
        Errorf(consumer(), nullptr, {},
               "Invalid argument for --set-spec-const-default-value: %s",
               pass_args.c_str());
        return false;
      }
      RegisterPass(
          CreateSetSpecConstantDefaultValuePass(std::move(*spec_ids_vals)));
    } else {
      Errorf(consumer(), nullptr, {},
             "Invalid spec constant value string '%s'. Expected a string of "
             "<spec id>:<default value> pairs.",
             pass_args.c_str());
      return false;
    }
  } else if (pass_name == "if-conversion") {
    RegisterPass(CreateIfConversionPass());
  } else if (pass_name == "freeze-spec-const") {
    RegisterPass(CreateFreezeSpecConstantValuePass());
  } else if (pass_name == "inline-entry-points-exhaustive") {
    RegisterPass(CreateInlineExhaustivePass());
  } else if (pass_name == "inline-entry-points-opaque") {
    RegisterPass(CreateInlineOpaquePass());
  } else if (pass_name == "combine-access-chains") {
    RegisterPass(CreateCombineAccessChainsPass());
  } else if (pass_name == "convert-local-access-chains") {
    RegisterPass(CreateLocalAccessChainConvertPass());
  } else if (pass_name == "replace-desc-array-access-using-var-index") {
    RegisterPass(CreateReplaceDescArrayAccessUsingVarIndexPass());
  } else if (pass_name == "spread-volatile-semantics") {
    RegisterPass(CreateSpreadVolatileSemanticsPass());
  } else if (pass_name == "descriptor-scalar-replacement") {
    RegisterPass(CreateDescriptorScalarReplacementPass());
  } else if (pass_name == "descriptor-composite-scalar-replacement") {
    RegisterPass(CreateDescriptorCompositeScalarReplacementPass());
  } else if (pass_name == "descriptor-array-scalar-replacement") {
    RegisterPass(CreateDescriptorArrayScalarReplacementPass());
  } else if (pass_name == "eliminate-dead-code-aggressive") {
    RegisterPass(CreateAggressiveDCEPass(preserve_interface));
  } else if (pass_name == "eliminate-insert-extract") {
    RegisterPass(CreateInsertExtractElimPass());
  } else if (pass_name == "eliminate-local-single-block") {
    RegisterPass(CreateLocalSingleBlockLoadStoreElimPass());
  } else if (pass_name == "eliminate-local-single-store") {
    RegisterPass(CreateLocalSingleStoreElimPass());
  } else if (pass_name == "merge-blocks") {
    RegisterPass(CreateBlockMergePass());
  } else if (pass_name == "merge-return") {
    RegisterPass(CreateMergeReturnPass());
  } else if (pass_name == "eliminate-dead-branches") {
    RegisterPass(CreateDeadBranchElimPass());
  } else if (pass_name == "eliminate-dead-functions") {
    RegisterPass(CreateEliminateDeadFunctionsPass());
  } else if (pass_name == "eliminate-local-multi-store") {
    RegisterPass(CreateLocalMultiStoreElimPass());
  } else if (pass_name == "eliminate-dead-const") {
    RegisterPass(CreateEliminateDeadConstantPass());
  } else if (pass_name == "eliminate-dead-inserts") {
    RegisterPass(CreateDeadInsertElimPass());
  } else if (pass_name == "eliminate-dead-variables") {
    RegisterPass(CreateDeadVariableEliminationPass());
  } else if (pass_name == "eliminate-dead-members") {
    RegisterPass(CreateEliminateDeadMembersPass());
  } else if (pass_name == "fold-spec-const-op-composite") {
    RegisterPass(CreateFoldSpecConstantOpAndCompositePass());
  } else if (pass_name == "loop-unswitch") {
    RegisterPass(CreateLoopUnswitchPass());
  } else if (pass_name == "scalar-replacement") {
    if (pass_args.size() == 0) {
      RegisterPass(CreateScalarReplacementPass());
    } else {
      int limit = -1;
      if (pass_args.find_first_not_of("0123456789") == std::string::npos) {
        limit = atoi(pass_args.c_str());
      }

      if (limit >= 0) {
        RegisterPass(CreateScalarReplacementPass(limit));
      } else {
        Error(consumer(), nullptr, {},
              "--scalar-replacement must have no arguments or a non-negative "
              "integer argument");
        return false;
      }
    }
  } else if (pass_name == "strength-reduction") {
    RegisterPass(CreateStrengthReductionPass());
  } else if (pass_name == "unify-const") {
    RegisterPass(CreateUnifyConstantPass());
  } else if (pass_name == "flatten-decorations") {
    RegisterPass(CreateFlattenDecorationPass());
  } else if (pass_name == "compact-ids") {
    RegisterPass(CreateCompactIdsPass());
  } else if (pass_name == "cfg-cleanup") {
    RegisterPass(CreateCFGCleanupPass());
  } else if (pass_name == "local-redundancy-elimination") {
    RegisterPass(CreateLocalRedundancyEliminationPass());
  } else if (pass_name == "loop-invariant-code-motion") {
    RegisterPass(CreateLoopInvariantCodeMotionPass());
  } else if (pass_name == "reduce-load-size") {
    if (pass_args.size() == 0) {
      RegisterPass(CreateReduceLoadSizePass());
    } else {
      double load_replacement_threshold = 0.9;
      if (pass_args.find_first_not_of(".0123456789") == std::string::npos) {
        load_replacement_threshold = atof(pass_args.c_str());
      }

      if (load_replacement_threshold >= 0) {
        RegisterPass(CreateReduceLoadSizePass(load_replacement_threshold));
      } else {
        Error(consumer(), nullptr, {},
              "--reduce-load-size must have no arguments or a non-negative "
              "double argument");
        return false;
      }
    }
  } else if (pass_name == "redundancy-elimination") {
    RegisterPass(CreateRedundancyEliminationPass());
  } else if (pass_name == "private-to-local") {
    RegisterPass(CreatePrivateToLocalPass());
  } else if (pass_name == "remove-duplicates") {
    RegisterPass(CreateRemoveDuplicatesPass());
  } else if (pass_name == "workaround-1209") {
    RegisterPass(CreateWorkaround1209Pass());
  } else if (pass_name == "replace-invalid-opcode") {
    RegisterPass(CreateReplaceInvalidOpcodePass());
  } else if (pass_name == "convert-relaxed-to-half") {
    RegisterPass(CreateConvertRelaxedToHalfPass());
  } else if (pass_name == "relax-float-ops") {
    RegisterPass(CreateRelaxFloatOpsPass());
  } else if (pass_name == "inst-debug-printf") {
    // This private option is not for user consumption.
    // It is here to assist in debugging and fixing the debug printf
    // instrumentation pass.
    // For users who wish to utilize debug printf, see the white paper at
    // https://www.lunarg.com/wp-content/uploads/2021/08/Using-Debug-Printf-02August2021.pdf
    RegisterPass(CreateInstDebugPrintfPass(7, 23));
  } else if (pass_name == "simplify-instructions") {
    RegisterPass(CreateSimplificationPass());
  } else if (pass_name == "ssa-rewrite") {
    RegisterPass(CreateSSARewritePass());
  } else if (pass_name == "copy-propagate-arrays") {
    RegisterPass(CreateCopyPropagateArraysPass());
  } else if (pass_name == "loop-fission") {
    int register_threshold_to_split =
        (pass_args.size() > 0) ? atoi(pass_args.c_str()) : -1;
    if (register_threshold_to_split > 0) {
      RegisterPass(CreateLoopFissionPass(
          static_cast<size_t>(register_threshold_to_split)));
    } else {
      Error(consumer(), nullptr, {},
            "--loop-fission must have a positive integer argument");
      return false;
    }
  } else if (pass_name == "loop-fusion") {
    int max_registers_per_loop =
        (pass_args.size() > 0) ? atoi(pass_args.c_str()) : -1;
    if (max_registers_per_loop > 0) {
      RegisterPass(
          CreateLoopFusionPass(static_cast<size_t>(max_registers_per_loop)));
    } else {
      Error(consumer(), nullptr, {},
            "--loop-fusion must have a positive integer argument");
      return false;
    }
  } else if (pass_name == "loop-unroll") {
    RegisterPass(CreateLoopUnrollPass(true));
  } else if (pass_name == "upgrade-memory-model") {
    RegisterPass(CreateUpgradeMemoryModelPass());
  } else if (pass_name == "vector-dce") {
    RegisterPass(CreateVectorDCEPass());
  } else if (pass_name == "loop-unroll-partial") {
    int factor = (pass_args.size() > 0) ? atoi(pass_args.c_str()) : 0;
    if (factor > 0) {
      RegisterPass(CreateLoopUnrollPass(false, factor));
    } else {
      Error(consumer(), nullptr, {},
            "--loop-unroll-partial must have a positive integer argument");
      return false;
    }
  } else if (pass_name == "loop-peeling") {
    RegisterPass(CreateLoopPeelingPass());
  } else if (pass_name == "loop-peeling-threshold") {
    int factor = (pass_args.size() > 0) ? atoi(pass_args.c_str()) : 0;
    if (factor > 0) {
      opt::LoopPeelingPass::SetLoopPeelingThreshold(factor);
    } else {
      Error(consumer(), nullptr, {},
            "--loop-peeling-threshold must have a positive integer argument");
      return false;
    }
  } else if (pass_name == "ccp") {
    RegisterPass(CreateCCPPass());
  } else if (pass_name == "code-sink") {
    RegisterPass(CreateCodeSinkingPass());
  } else if (pass_name == "fix-storage-class") {
    RegisterPass(CreateFixStorageClassPass());
  } else if (pass_name == "O") {
    RegisterPerformancePasses(preserve_interface);
  } else if (pass_name == "Os") {
    RegisterSizePasses(preserve_interface);
  } else if (pass_name == "legalize-hlsl") {
    RegisterLegalizationPasses(preserve_interface);
  } else if (pass_name == "remove-unused-interface-variables") {
    RegisterPass(CreateRemoveUnusedInterfaceVariablesPass());
  } else if (pass_name == "graphics-robust-access") {
    RegisterPass(CreateGraphicsRobustAccessPass());
  } else if (pass_name == "wrap-opkill") {
    RegisterPass(CreateWrapOpKillPass());
  } else if (pass_name == "amd-ext-to-khr") {
    RegisterPass(CreateAmdExtToKhrPass());
  } else if (pass_name == "interpolate-fixup") {
    RegisterPass(CreateInterpolateFixupPass());
  } else if (pass_name == "remove-dont-inline") {
    RegisterPass(CreateRemoveDontInlinePass());
  } else if (pass_name == "eliminate-dead-input-components") {
    RegisterPass(CreateEliminateDeadInputComponentsSafePass());
  } else if (pass_name == "fix-func-call-param") {
    RegisterPass(CreateFixFuncCallArgumentsPass());
  } else if (pass_name == "convert-to-sampled-image") {
    if (pass_args.size() > 0) {
      auto descriptor_set_binding_pairs =
          opt::ConvertToSampledImagePass::ParseDescriptorSetBindingPairsString(
              pass_args.c_str());
      if (!descriptor_set_binding_pairs) {
        Errorf(consumer(), nullptr, {},
               "Invalid argument for --convert-to-sampled-image: %s",
               pass_args.c_str());
        return false;
      }
      RegisterPass(CreateConvertToSampledImagePass(
          std::move(*descriptor_set_binding_pairs)));
    } else {
      Errorf(consumer(), nullptr, {},
             "Invalid pairs of descriptor set and binding '%s'. Expected a "
             "string of <descriptor set>:<binding> pairs.",
             pass_args.c_str());
      return false;
    }
  } else if (pass_name == "struct-packing") {
    if (pass_args.size() == 0) {
      Error(consumer(), nullptr, {},
            "--struct-packing requires a name:rule argument.");
      return false;
    }

    auto separator_pos = pass_args.find(':');
    if (separator_pos == std::string::npos || separator_pos == 0 ||
        separator_pos + 1 == pass_args.size()) {
      Errorf(consumer(), nullptr, {},
             "Invalid argument for --struct-packing: %s", pass_args.c_str());
      return false;
    }

    const std::string struct_name = pass_args.substr(0, separator_pos);
    const std::string rule_name = pass_args.substr(separator_pos + 1);

    RegisterPass(
        CreateStructPackingPass(struct_name.c_str(), rule_name.c_str()));
  } else if (pass_name == "switch-descriptorset") {
    if (pass_args.size() == 0) {
      Error(consumer(), nullptr, {},
            "--switch-descriptorset requires a from:to argument.");
      return false;
    }
    uint32_t from_set = 0, to_set = 0;
    const char* start = pass_args.data();
    const char* end = pass_args.data() + pass_args.size();

    auto result = std::from_chars(start, end, from_set);
    if (result.ec != std::errc()) {
      Errorf(consumer(), nullptr, {},
             "Invalid argument for --switch-descriptorset: %s",
             pass_args.c_str());
      return false;
    }
    start = result.ptr;
    if (start[0] != ':') {
      Errorf(consumer(), nullptr, {},
             "Invalid argument for --switch-descriptorset: %s",
             pass_args.c_str());
      return false;
    }
    start++;
    result = std::from_chars(start, end, to_set);
    if (result.ec != std::errc() || result.ptr != end) {
      Errorf(consumer(), nullptr, {},
             "Invalid argument for --switch-descriptorset: %s",
             pass_args.c_str());
      return false;
    }
    RegisterPass(CreateSwitchDescriptorSetPass(from_set, to_set));
  } else if (pass_name == "modify-maximal-reconvergence") {
    if (pass_args.size() == 0) {
      Error(consumer(), nullptr, {},
            "--modify-maximal-reconvergence requires an argument");
      return false;
    }
    if (pass_args == "add") {
      RegisterPass(CreateModifyMaximalReconvergencePass(true));
    } else if (pass_args == "remove") {
      RegisterPass(CreateModifyMaximalReconvergencePass(false));
    } else {
      Errorf(consumer(), nullptr, {},
             "Invalid argument for --modify-maximal-reconvergence: %s (must be "
             "'add' or 'remove')",
             pass_args.c_str());
      return false;
    }
  } else if (pass_name == "trim-capabilities") {
    RegisterPass(CreateTrimCapabilitiesPass());
  } else {
    Errorf(consumer(), nullptr, {},
           "Unknown flag '--%s'. Use --help for a list of valid flags",
           pass_name.c_str());
    return false;
  }

  return true;
}